

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O2

string * __thiscall
elf_parser::Elf_parser::get_section_type_abi_cxx11_
          (string *__return_storage_ptr__,Elf_parser *this,int tt)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (tt < 0) {
    pcVar2 = "UNKNOWN";
    paVar1 = &local_9;
  }
  else {
    switch(tt) {
    case 0:
      pcVar2 = "SHT_NULL";
      paVar1 = &local_a;
      break;
    case 1:
      pcVar2 = "SHT_PROGBITS";
      paVar1 = &local_b;
      break;
    case 2:
      pcVar2 = "SHT_SYMTAB";
      paVar1 = &local_c;
      break;
    case 3:
      pcVar2 = "SHT_STRTAB";
      paVar1 = &local_d;
      break;
    case 4:
      pcVar2 = "SHT_RELA";
      paVar1 = &local_e;
      break;
    case 5:
      pcVar2 = "SHT_HASH";
      paVar1 = &local_f;
      break;
    case 6:
      pcVar2 = "SHT_DYNAMIC";
      paVar1 = &local_10;
      break;
    case 7:
      pcVar2 = "SHT_NOTE";
      paVar1 = &local_11;
      break;
    case 8:
      pcVar2 = "SHT_NOBITS";
      paVar1 = &local_12;
      break;
    case 9:
      pcVar2 = "SHT_REL";
      paVar1 = &local_13;
      break;
    default:
      pcVar2 = "UNKNOWN";
      paVar1 = &local_15;
      break;
    case 0xb:
      pcVar2 = "SHT_DYNSYM";
      paVar1 = &local_14;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Elf_parser::get_section_type(int tt) {
    if(tt < 0)
        return "UNKNOWN";

    switch(tt) {
        case 0: return "SHT_NULL";      /* Section header table entry unused */
        case 1: return "SHT_PROGBITS";  /* Program data */
        case 2: return "SHT_SYMTAB";    /* Symbol table */
        case 3: return "SHT_STRTAB";    /* String table */
        case 4: return "SHT_RELA";      /* Relocation entries with addends */
        case 5: return "SHT_HASH";      /* Symbol hash table */
        case 6: return "SHT_DYNAMIC";   /* Dynamic linking information */
        case 7: return "SHT_NOTE";      /* Notes */
        case 8: return "SHT_NOBITS";    /* Program space with no data (bss) */
        case 9: return "SHT_REL";       /* Relocation entries, no addends */
        case 11: return "SHT_DYNSYM";   /* Dynamic linker symbol table */
        default: return "UNKNOWN";
    }
    return "UNKNOWN";
}